

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O0

void MWT::value_policy(mwt *c,float val,uint64_t index)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ostream *poVar3;
  uint64_t uVar4;
  ulong i;
  policy_data *ppVar5;
  ulong in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  double dVar6;
  uint64_t new_index;
  uint32_t value;
  parameters *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (0.0 <= in_XMM0_Da) {
    dVar6 = std::floor((double)(ulong)(uint)in_XMM0_Da);
    if ((SUB84(dVar6,0) == in_XMM0_Da) && (!NAN(SUB84(dVar6,0)) && !NAN(in_XMM0_Da)))
    goto LAB_0021c583;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"error ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_XMM0_Da);
  poVar3 = std::operator<<(poVar3," is not a valid action ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
LAB_0021c583:
  uVar1 = (uint32_t)(long)in_XMM0_Da;
  uVar4 = parameters::mask(in_stack_ffffffffffffffb8);
  uVar2 = parameters::stride_shift(in_stack_ffffffffffffffb8);
  i = (in_RSI & uVar4) >> ((byte)uVar2 & 0x3f);
  ppVar5 = v_array<MWT::policy_data>::operator[]((v_array<MWT::policy_data> *)(in_RDI + 0x100),i);
  if ((ppVar5->seen & 1U) == 0) {
    ppVar5 = v_array<MWT::policy_data>::operator[]((v_array<MWT::policy_data> *)(in_RDI + 0x100),i);
    ppVar5->seen = true;
    v_array<unsigned_long>::push_back
              ((v_array<unsigned_long> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (unsigned_long *)in_stack_ffffffffffffffb8);
  }
  ppVar5 = v_array<MWT::policy_data>::operator[]((v_array<MWT::policy_data> *)(in_RDI + 0x100),i);
  ppVar5->action = uVar1;
  return;
}

Assistant:

void value_policy(mwt& c, float val, uint64_t index)  // estimate the value of a single feature.
{
  if (val < 0 || floor(val) != val)
    cout << "error " << val << " is not a valid action " << endl;

  uint32_t value = (uint32_t)val;
  uint64_t new_index = (index & c.all->weights.mask()) >> c.all->weights.stride_shift();

  if (!c.evals[new_index].seen)
  {
    c.evals[new_index].seen = true;
    c.policies.push_back(new_index);
  }

  c.evals[new_index].action = value;
}